

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.cpp
# Opt level: O0

void __thiscall ast::Dir_byte::~Dir_byte(Dir_byte *this)

{
  list<ast::Expression_*,_std::allocator<ast::Expression_*>_> *plVar1;
  bool bVar2;
  reference ppEVar3;
  Expression *s;
  iterator __end1;
  iterator __begin1;
  list<ast::Expression_*,_std::allocator<ast::Expression_*>_> *__range1;
  Dir_byte *this_local;
  
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Dir_byte_0017e890;
  plVar1 = this->value_list;
  __end1 = std::__cxx11::list<ast::Expression_*,_std::allocator<ast::Expression_*>_>::begin(plVar1);
  s = (Expression *)
      std::__cxx11::list<ast::Expression_*,_std::allocator<ast::Expression_*>_>::end(plVar1);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&s);
    if (!bVar2) break;
    ppEVar3 = std::_List_iterator<ast::Expression_*>::operator*(&__end1);
    if (*ppEVar3 != (Expression *)0x0) {
      (*(*ppEVar3)->_vptr_Expression[1])();
    }
    std::_List_iterator<ast::Expression_*>::operator++(&__end1);
  }
  plVar1 = this->value_list;
  if (plVar1 != (list<ast::Expression_*,_std::allocator<ast::Expression_*>_> *)0x0) {
    std::__cxx11::list<ast::Expression_*,_std::allocator<ast::Expression_*>_>::~list(plVar1);
    operator_delete(plVar1);
  }
  Directive::~Directive(&this->super_Directive);
  return;
}

Assistant:

Dir_byte::~Dir_byte()
{
	for (auto s: *value_list)
		delete s;
	delete value_list;
}